

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

void __thiscall jsonnet::internal::Unparser::unparse(Unparser *this,AST *ast_,bool space_before)

{
  Hide HVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  AST *pAVar5;
  ostream *poVar6;
  size_type sVar7;
  const_reference pvVar8;
  char32_t *pcVar9;
  long lVar10;
  reference ppAVar11;
  void *this_00;
  byte in_DL;
  Unparser *in_RSI;
  char *pcVar12;
  undefined8 *in_RDI;
  Var *ast_26;
  Unary *ast_25;
  SuperIndex *ast_24;
  Parens *ast_23;
  ObjectComprehensionSimple *ast_22;
  ObjectComprehension *ast_21;
  Field *field;
  const_iterator __end25_1;
  const_iterator __begin25_1;
  Fields *__range25_1;
  AST *assert;
  const_iterator __end25;
  const_iterator __begin25;
  ASTs *__range25;
  DesugaredObject *ast_20;
  Object *ast_19;
  string utf8_2;
  char32_t *cp_2;
  string utf8_1;
  char32_t *cp_1;
  string utf8;
  char32_t *cp;
  LiteralString *ast_18;
  LiteralNumber *ast_17;
  LiteralBoolean *ast_16;
  Bind *bind;
  const_iterator __end19;
  const_iterator __begin19;
  Binds *__range19;
  bool first_2;
  Local *ast_15;
  Index *ast_14;
  InSuper *ast_13;
  Importbin *ast_12;
  Importstr *ast_11;
  Import *ast_10;
  Function *ast_9;
  Error *ast_8;
  Conditional *ast_7;
  BuiltinFunction *ast_6;
  Binary *ast_5;
  Assert *ast_4;
  ArrayComprehension *ast_3;
  Element *element;
  const_iterator __end5;
  const_iterator __begin5;
  Elements *__range5;
  bool first_1;
  Array *ast_2;
  ApplyBrace *ast_1;
  bool space;
  ArgParam *arg;
  const_iterator __end3;
  const_iterator __begin3;
  ArgParams *__range3;
  bool first;
  Apply *ast;
  bool separate_token;
  string *in_stack_fffffffffffff9b8;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_fffffffffffff9c0;
  string *psVar13;
  long local_638;
  UString *in_stack_fffffffffffff9d8;
  long local_618;
  undefined8 in_stack_fffffffffffff9f8;
  UnaryOp uop;
  long local_5f8;
  long local_5e8;
  Fodder *in_stack_fffffffffffffa20;
  vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
  *in_stack_fffffffffffffa28;
  Unparser *in_stack_fffffffffffffa30;
  Fodder *in_stack_fffffffffffffa38;
  Unparser *in_stack_fffffffffffffa40;
  long local_5b0;
  long local_5a0;
  long local_588;
  undefined8 in_stack_fffffffffffffa88;
  BinaryOp bop;
  long local_570;
  Unparser *in_stack_fffffffffffffab0;
  long local_518;
  long local_508;
  long local_4f8;
  long local_4d8;
  long local_4b8;
  long local_4a8;
  long local_498;
  long local_488;
  long local_478;
  long local_468;
  long local_458;
  long local_448;
  long local_438;
  long local_428;
  long local_408;
  long local_3f8;
  long local_3e8;
  long local_3c0;
  long local_3b0;
  long local_390;
  string local_378 [32];
  long local_358;
  string local_350 [32];
  long local_330;
  string local_328 [32];
  long local_308;
  long local_300;
  string local_2f8 [32];
  long local_2d8;
  long local_2d0;
  reference local_2c8;
  Field *local_2c0;
  __normal_iterator<const_jsonnet::internal::DesugaredObject::Field_*,_std::vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>_>
  local_2b8;
  long local_2b0;
  AST *local_2a8;
  _Self local_2a0;
  _Self local_298;
  long local_290;
  long local_288;
  long local_280;
  string local_278 [32];
  char32_t *local_258;
  string local_250 [32];
  char32_t *local_230;
  string local_228 [32];
  char32_t *local_208;
  string local_200 [32];
  string local_1e0 [32];
  long local_1c0;
  long local_1b8;
  long local_1b0;
  string local_1a8 [32];
  reference local_188;
  Bind *local_180;
  __normal_iterator<const_jsonnet::internal::Local::Bind_*,_std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>_>
  local_178;
  long local_170;
  byte local_161;
  long local_160;
  string local_158 [32];
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  string local_f0 [32];
  long local_d0;
  long local_c8;
  long local_c0;
  reference local_b8;
  Element *local_b0;
  __normal_iterator<const_jsonnet::internal::Array::Element_*,_std::vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>_>
  local_a8;
  long local_a0;
  byte local_91;
  long local_90;
  long local_88;
  string local_70 [39];
  byte local_49;
  reference local_48;
  ArgParam *local_40;
  __normal_iterator<const_jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
  local_38;
  long local_30;
  byte local_21;
  undefined1 uVar14;
  undefined1 space_before_00;
  undefined6 in_stack_ffffffffffffffe8;
  Unparser *pUVar15;
  
  uop = (UnaryOp)((ulong)in_stack_fffffffffffff9f8 >> 0x20);
  bop = (BinaryOp)((ulong)in_stack_fffffffffffffa88 >> 0x20);
  bVar2 = in_DL & 1;
  pAVar5 = left_recursive((AST *)0x3607bf);
  bVar3 = (pAVar5 != (AST *)0x0 ^ 0xffU) & 1;
  fill((Unparser *)in_stack_fffffffffffff9c0,(Fodder *)in_stack_fffffffffffff9b8,false,false);
  if (in_RSI == (Unparser *)0x0) {
    local_390 = 0;
  }
  else {
    local_390 = __dynamic_cast(in_RSI,&AST::typeinfo,&Apply::typeinfo,0);
  }
  if (local_390 == 0) {
    if (in_RSI == (Unparser *)0x0) {
      local_3b0 = 0;
    }
    else {
      local_3b0 = __dynamic_cast(in_RSI,&AST::typeinfo,&ApplyBrace::typeinfo,0);
    }
    bVar4 = SUB81((ulong)local_390 >> 0x38,0);
    local_88 = local_3b0;
    if (local_3b0 == 0) {
      if (in_RSI == (Unparser *)0x0) {
        local_3c0 = 0;
      }
      else {
        local_3c0 = __dynamic_cast(in_RSI,&AST::typeinfo,&Array::typeinfo,0);
      }
      local_90 = local_3c0;
      if (local_3c0 == 0) {
        if (in_RSI == (Unparser *)0x0) {
          local_3e8 = 0;
        }
        else {
          local_3e8 = __dynamic_cast(in_RSI,&AST::typeinfo,&ArrayComprehension::typeinfo,0);
        }
        uVar14 = (undefined1)((ulong)local_390 >> 0x38);
        local_c0 = local_3e8;
        if (local_3e8 == 0) {
          if (in_RSI == (Unparser *)0x0) {
            local_3f8 = 0;
          }
          else {
            local_3f8 = __dynamic_cast(in_RSI,&AST::typeinfo,&Assert::typeinfo,0);
          }
          uVar14 = (undefined1)((ulong)local_390 >> 0x38);
          local_c8 = local_3f8;
          if (local_3f8 == 0) {
            if (in_RSI == (Unparser *)0x0) {
              local_408 = 0;
            }
            else {
              local_408 = __dynamic_cast(in_RSI,&AST::typeinfo,&Binary::typeinfo,0);
            }
            uVar14 = (undefined1)((ulong)local_390 >> 0x38);
            local_d0 = local_408;
            if (local_408 == 0) {
              if (in_RSI == (Unparser *)0x0) {
                local_428 = 0;
              }
              else {
                local_428 = __dynamic_cast(in_RSI,&AST::typeinfo,&BuiltinFunction::typeinfo,0);
              }
              local_f8 = local_428;
              if (local_428 == 0) {
                if (in_RSI == (Unparser *)0x0) {
                  local_438 = 0;
                }
                else {
                  local_438 = __dynamic_cast(in_RSI,&AST::typeinfo,&Conditional::typeinfo,0);
                }
                uVar14 = (undefined1)((ulong)local_390 >> 0x38);
                local_100 = local_438;
                if (local_438 == 0) {
                  if (in_RSI == (Unparser *)0x0) {
                    local_448 = 0;
                  }
                  else {
                    local_448 = __dynamic_cast(in_RSI,&AST::typeinfo,&Dollar::typeinfo,0);
                  }
                  if (local_448 == 0) {
                    if (in_RSI == (Unparser *)0x0) {
                      local_458 = 0;
                    }
                    else {
                      local_458 = __dynamic_cast(in_RSI,&AST::typeinfo,&Error::typeinfo,0);
                    }
                    uVar14 = (undefined1)((ulong)local_390 >> 0x38);
                    local_108 = local_458;
                    if (local_458 == 0) {
                      if (in_RSI == (Unparser *)0x0) {
                        local_468 = 0;
                      }
                      else {
                        local_468 = __dynamic_cast(in_RSI,&AST::typeinfo,&Function::typeinfo,0);
                      }
                      uVar14 = (undefined1)((ulong)local_390 >> 0x38);
                      local_110 = local_468;
                      if (local_468 == 0) {
                        if (in_RSI == (Unparser *)0x0) {
                          local_478 = 0;
                        }
                        else {
                          local_478 = __dynamic_cast(in_RSI,&AST::typeinfo,&Import::typeinfo,0);
                        }
                        uVar14 = (undefined1)((ulong)local_390 >> 0x38);
                        local_118 = local_478;
                        if (local_478 == 0) {
                          if (in_RSI == (Unparser *)0x0) {
                            local_488 = 0;
                          }
                          else {
                            local_488 = __dynamic_cast(in_RSI,&AST::typeinfo,&Importstr::typeinfo,0)
                            ;
                          }
                          uVar14 = (undefined1)((ulong)local_390 >> 0x38);
                          local_120 = local_488;
                          if (local_488 == 0) {
                            if (in_RSI == (Unparser *)0x0) {
                              local_498 = 0;
                            }
                            else {
                              local_498 = __dynamic_cast(in_RSI,&AST::typeinfo,&Importbin::typeinfo,
                                                         0);
                            }
                            uVar14 = (undefined1)((ulong)local_390 >> 0x38);
                            local_128 = local_498;
                            if (local_498 == 0) {
                              if (in_RSI == (Unparser *)0x0) {
                                local_4a8 = 0;
                              }
                              else {
                                local_4a8 = __dynamic_cast(in_RSI,&AST::typeinfo,&InSuper::typeinfo,
                                                           0);
                              }
                              local_130 = local_4a8;
                              if (local_4a8 == 0) {
                                if (in_RSI == (Unparser *)0x0) {
                                  local_4b8 = 0;
                                }
                                else {
                                  local_4b8 = __dynamic_cast(in_RSI,&AST::typeinfo,&Index::typeinfo,
                                                             0);
                                }
                                uVar14 = (undefined1)((ulong)local_390 >> 0x38);
                                local_138 = local_4b8;
                                if (local_4b8 == 0) {
                                  if (in_RSI == (Unparser *)0x0) {
                                    local_4d8 = 0;
                                  }
                                  else {
                                    local_4d8 = __dynamic_cast(in_RSI,&AST::typeinfo,
                                                               &Local::typeinfo,0);
                                  }
                                  local_160 = local_4d8;
                                  if (local_4d8 == 0) {
                                    if (in_RSI == (Unparser *)0x0) {
                                      local_4f8 = 0;
                                    }
                                    else {
                                      local_4f8 = __dynamic_cast(in_RSI,&AST::typeinfo,
                                                                 &LiteralBoolean::typeinfo,0);
                                    }
                                    local_1b0 = local_4f8;
                                    if (local_4f8 == 0) {
                                      if (in_RSI == (Unparser *)0x0) {
                                        local_508 = 0;
                                      }
                                      else {
                                        local_508 = __dynamic_cast(in_RSI,&AST::typeinfo,
                                                                   &LiteralNumber::typeinfo,0);
                                      }
                                      local_1b8 = local_508;
                                      if (local_508 == 0) {
                                        if (in_RSI == (Unparser *)0x0) {
                                          local_518 = 0;
                                        }
                                        else {
                                          local_518 = __dynamic_cast(in_RSI,&AST::typeinfo,
                                                                     &LiteralString::typeinfo,0);
                                        }
                                        local_1c0 = local_518;
                                        if (local_518 == 0) {
                                          pUVar15 = in_RSI;
                                          if (in_RSI == (Unparser *)0x0) {
                                            lVar10 = 0;
                                          }
                                          else {
                                            lVar10 = __dynamic_cast(in_RSI,&AST::typeinfo,
                                                                    &LiteralNull::typeinfo,0);
                                          }
                                          if (lVar10 == 0) {
                                            if (pUVar15 == (Unparser *)0x0) {
                                              local_570 = 0;
                                            }
                                            else {
                                              local_570 = __dynamic_cast(pUVar15,&AST::typeinfo,
                                                                         &Object::typeinfo,0);
                                            }
                                            uVar14 = (undefined1)((ulong)lVar10 >> 0x38);
                                            local_280 = local_570;
                                            if (local_570 == 0) {
                                              if (pUVar15 == (Unparser *)0x0) {
                                                local_588 = 0;
                                              }
                                              else {
                                                local_588 = __dynamic_cast(pUVar15,&AST::typeinfo,
                                                                           &DesugaredObject::
                                                                            typeinfo,0);
                                              }
                                              space_before_00 =
                                                   (undefined1)((ulong)local_390 >> 0x38);
                                              local_288 = local_588;
                                              if (local_588 == 0) {
                                                if (pUVar15 == (Unparser *)0x0) {
                                                  local_5a0 = 0;
                                                }
                                                else {
                                                  local_5a0 = __dynamic_cast(pUVar15,&AST::typeinfo,
                                                                             &ObjectComprehension::
                                                                              typeinfo,0);
                                                }
                                                local_2d0 = local_5a0;
                                                if (local_5a0 == 0) {
                                                  if (pUVar15 == (Unparser *)0x0) {
                                                    local_5b0 = 0;
                                                  }
                                                  else {
                                                    local_5b0 = __dynamic_cast(pUVar15,&AST::
                                                  typeinfo,&ObjectComprehensionSimple::typeinfo,0);
                                                  }
                                                  local_2d8 = local_5b0;
                                                  if (local_5b0 == 0) {
                                                    if (pUVar15 == (Unparser *)0x0) {
                                                      local_300 = 0;
                                                    }
                                                    else {
                                                      local_300 = __dynamic_cast(pUVar15,&AST::
                                                  typeinfo,&Parens::typeinfo,0);
                                                  }
                                                  if (local_300 == 0) {
                                                    if (pUVar15 == (Unparser *)0x0) {
                                                      local_5e8 = 0;
                                                    }
                                                    else {
                                                      local_5e8 = __dynamic_cast(pUVar15,&AST::
                                                  typeinfo,&Self::typeinfo,0);
                                                  }
                                                  if (local_5e8 == 0) {
                                                    if (pUVar15 == (Unparser *)0x0) {
                                                      local_5f8 = 0;
                                                    }
                                                    else {
                                                      local_5f8 = __dynamic_cast(pUVar15,&AST::
                                                  typeinfo,&SuperIndex::typeinfo,0);
                                                  }
                                                  local_308 = local_5f8;
                                                  if (local_5f8 == 0) {
                                                    if (pUVar15 == (Unparser *)0x0) {
                                                      local_618 = 0;
                                                    }
                                                    else {
                                                      local_618 = __dynamic_cast(pUVar15,&AST::
                                                  typeinfo,&Unary::typeinfo,0);
                                                  }
                                                  local_330 = local_618;
                                                  if (local_618 == 0) {
                                                    if (pUVar15 == (Unparser *)0x0) {
                                                      local_638 = 0;
                                                    }
                                                    else {
                                                      local_638 = __dynamic_cast(pUVar15,&AST::
                                                  typeinfo,&Var::typeinfo,0);
                                                  }
                                                  local_358 = local_638;
                                                  if (local_638 == 0) {
                                                    poVar6 = std::operator<<((ostream *)&std::cerr,
                                                                                                                                                          
                                                  "INTERNAL ERROR: Unknown AST: ");
                                                  this_00 = (void *)std::ostream::operator<<
                                                                              (poVar6,pUVar15);
                                                  std::ostream::operator<<
                                                            (this_00,std::
                                                  endl<char,std::char_traits<char>>);
                                                  abort();
                                                  }
                                                  poVar6 = (ostream *)*in_RDI;
                                                  psVar13 = local_378;
                                                  encode_utf8(in_stack_fffffffffffff9d8);
                                                  std::operator<<(poVar6,psVar13);
                                                  std::__cxx11::string::~string(local_378);
                                                  }
                                                  else {
                                                    poVar6 = (ostream *)*in_RDI;
                                                    uop_string_abi_cxx11_(uop);
                                                    std::operator<<(poVar6,local_350);
                                                    std::__cxx11::string::~string(local_350);
                                                    unparse(pUVar15,(AST *)CONCAT17(bVar2,CONCAT16(
                                                  bVar3,in_stack_ffffffffffffffe8)),
                                                  (bool)space_before_00);
                                                  }
                                                  }
                                                  else {
                                                    std::operator<<((ostream *)*in_RDI,"super");
                                                    fill((Unparser *)in_stack_fffffffffffff9c0,
                                                         (Fodder *)in_stack_fffffffffffff9b8,false,
                                                         false);
                                                    if (*(long *)(local_308 + 0xb8) == 0) {
                                                      std::operator<<((ostream *)*in_RDI,"[");
                                                      unparse(pUVar15,(AST *)CONCAT17(bVar2,CONCAT16
                                                  (bVar3,in_stack_ffffffffffffffe8)),
                                                  (bool)space_before_00);
                                                  fill((Unparser *)in_stack_fffffffffffff9c0,
                                                       (Fodder *)in_stack_fffffffffffff9b8,false,
                                                       false);
                                                  std::operator<<((ostream *)*in_RDI,"]");
                                                  }
                                                  else {
                                                    std::operator<<((ostream *)*in_RDI,".");
                                                    fill((Unparser *)in_stack_fffffffffffff9c0,
                                                         (Fodder *)in_stack_fffffffffffff9b8,false,
                                                         false);
                                                    poVar6 = (ostream *)*in_RDI;
                                                    unparse_id_abi_cxx11_
                                                              ((Identifier *)
                                                               in_stack_fffffffffffff9b8);
                                                    std::operator<<(poVar6,local_328);
                                                    std::__cxx11::string::~string(local_328);
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    std::operator<<((ostream *)*in_RDI,"self");
                                                  }
                                                  }
                                                  else {
                                                    std::operator<<((ostream *)*in_RDI,"(");
                                                    unparse(pUVar15,(AST *)CONCAT17(bVar2,CONCAT16(
                                                  bVar3,in_stack_ffffffffffffffe8)),
                                                  (bool)space_before_00);
                                                  fill((Unparser *)in_stack_fffffffffffff9c0,
                                                       (Fodder *)in_stack_fffffffffffff9b8,false,
                                                       false);
                                                  std::operator<<((ostream *)*in_RDI,")");
                                                  }
                                                  }
                                                  else {
                                                    std::operator<<((ostream *)*in_RDI,"{[");
                                                    unparse(pUVar15,(AST *)CONCAT17(bVar2,CONCAT16(
                                                  bVar3,in_stack_ffffffffffffffe8)),
                                                  (bool)space_before_00);
                                                  std::operator<<((ostream *)*in_RDI,"]:");
                                                  unparse(pUVar15,(AST *)CONCAT17(bVar2,CONCAT16(
                                                  bVar3,in_stack_ffffffffffffffe8)),
                                                  (bool)space_before_00);
                                                  poVar6 = std::operator<<((ostream *)*in_RDI,
                                                                           " for ");
                                                  psVar13 = local_2f8;
                                                  unparse_id_abi_cxx11_
                                                            ((Identifier *)in_stack_fffffffffffff9b8
                                                            );
                                                  poVar6 = std::operator<<(poVar6,psVar13);
                                                  std::operator<<(poVar6," in");
                                                  std::__cxx11::string::~string(local_2f8);
                                                  unparse(pUVar15,(AST *)CONCAT17(bVar2,CONCAT16(
                                                  bVar3,in_stack_ffffffffffffffe8)),
                                                  (bool)space_before_00);
                                                  std::operator<<((ostream *)*in_RDI,"}");
                                                  }
                                                }
                                                else {
                                                  std::operator<<((ostream *)*in_RDI,"{");
                                                  unparseFields(in_stack_fffffffffffffab0,
                                                                (ObjectFields *)in_RSI,(bool)uVar14)
                                                  ;
                                                  if ((*(byte *)(local_2d0 + 0x98) & 1) != 0) {
                                                    std::operator<<((ostream *)*in_RDI,",");
                                                  }
                                                  unparseSpecs(in_stack_fffffffffffffa30,
                                                               in_stack_fffffffffffffa28);
                                                  fill((Unparser *)in_stack_fffffffffffff9c0,
                                                       (Fodder *)in_stack_fffffffffffff9b8,false,
                                                       false);
                                                  std::operator<<((ostream *)*in_RDI,"}");
                                                }
                                              }
                                              else {
                                                std::operator<<((ostream *)*in_RDI,"{");
                                                local_290 = local_288 + 0x80;
                                                local_298._M_node =
                                                     (_List_node_base *)
                                                     std::__cxx11::
                                                                                                          
                                                  list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>
                                                  ::begin((
                                                  list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>
                                                  *)in_stack_fffffffffffff9b8);
                                                local_2a0._M_node =
                                                     (_List_node_base *)
                                                     std::__cxx11::
                                                                                                          
                                                  list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>
                                                  ::end((
                                                  list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>
                                                  *)in_stack_fffffffffffff9b8);
                                                while (bVar4 = std::operator!=(&local_298,&local_2a0
                                                                              ), bVar4) {
                                                  ppAVar11 = std::
                                                  _List_const_iterator<jsonnet::internal::AST_*>::
                                                  operator*((
                                                  _List_const_iterator<jsonnet::internal::AST_*> *)
                                                  in_stack_fffffffffffff9c0);
                                                  local_2a8 = *ppAVar11;
                                                  std::operator<<((ostream *)*in_RDI,"assert");
                                                  unparse(pUVar15,(AST *)CONCAT17(bVar2,CONCAT16(
                                                  bVar3,in_stack_ffffffffffffffe8)),
                                                  SUB81((ulong)local_390 >> 0x38,0));
                                                  std::operator<<((ostream *)*in_RDI,",");
                                                  std::
                                                  _List_const_iterator<jsonnet::internal::AST_*>::
                                                  operator++(&local_298);
                                                }
                                                local_2b0 = local_288 + 0x98;
                                                local_2b8._M_current =
                                                     (Field *)std::
                                                  vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
                                                  ::begin((
                                                  vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
                                                  *)in_stack_fffffffffffff9b8);
                                                local_2c0 = (Field *)std::
                                                  vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
                                                  ::end((
                                                  vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
                                                  *)in_stack_fffffffffffff9b8);
                                                while (bVar4 = __gnu_cxx::operator!=
                                                                         ((
                                                  __normal_iterator<const_jsonnet::internal::DesugaredObject::Field_*,_std::vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>_>
                                                  *)in_stack_fffffffffffff9c0,
                                                  (
                                                  __normal_iterator<const_jsonnet::internal::DesugaredObject::Field_*,_std::vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>_>
                                                  *)in_stack_fffffffffffff9b8), bVar4) {
                                                  local_2c8 = __gnu_cxx::
                                                                                                                            
                                                  __normal_iterator<const_jsonnet::internal::DesugaredObject::Field_*,_std::vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>_>
                                                  ::operator*(&local_2b8);
                                                  std::operator<<((ostream *)*in_RDI,"[");
                                                  unparse(pUVar15,(AST *)CONCAT17(bVar2,CONCAT16(
                                                  bVar3,in_stack_ffffffffffffffe8)),
                                                  SUB81((ulong)local_390 >> 0x38,0));
                                                  std::operator<<((ostream *)*in_RDI,"]");
                                                  HVar1 = local_2c8->hide;
                                                  if (HVar1 == HIDDEN) {
                                                    std::operator<<((ostream *)*in_RDI,"::");
                                                  }
                                                  else if (HVar1 == INHERIT) {
                                                    std::operator<<((ostream *)*in_RDI,":");
                                                  }
                                                  else if (HVar1 == VISIBLE) {
                                                    std::operator<<((ostream *)*in_RDI,":::");
                                                  }
                                                  unparse(pUVar15,(AST *)CONCAT17(bVar2,CONCAT16(
                                                  bVar3,in_stack_ffffffffffffffe8)),
                                                  SUB81((ulong)local_390 >> 0x38,0));
                                                  std::operator<<((ostream *)*in_RDI,",");
                                                  __gnu_cxx::
                                                  __normal_iterator<const_jsonnet::internal::DesugaredObject::Field_*,_std::vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>_>
                                                  ::operator++(&local_2b8);
                                                }
                                                std::operator<<((ostream *)*in_RDI,"}");
                                              }
                                            }
                                            else {
                                              std::operator<<((ostream *)*in_RDI,"{");
                                              unparseFields(in_stack_fffffffffffffab0,
                                                            (ObjectFields *)in_RSI,(bool)uVar14);
                                              if ((*(byte *)(local_280 + 0x98) & 1) != 0) {
                                                std::operator<<((ostream *)*in_RDI,",");
                                              }
                                              std::
                                              vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                                              ::size((
                                                  vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                                                  *)(local_280 + 0x80));
                                              fill((Unparser *)in_stack_fffffffffffff9c0,
                                                   (Fodder *)in_stack_fffffffffffff9b8,false,false);
                                              std::operator<<((ostream *)*in_RDI,"}");
                                            }
                                          }
                                          else {
                                            std::operator<<((ostream *)*in_RDI,"null");
                                          }
                                        }
                                        else {
                                          if (*(int *)(local_518 + 0xa0) == 5) {
                                            __assert_fail(
                                                  "ast->tokenKind != LiteralString::RAW_DESUGARED",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/formatter.cpp"
                                                  ,0x1ed,
                                                  "void jsonnet::internal::Unparser::unparse(const AST *, bool)"
                                                  );
                                          }
                                          if (*(int *)(local_518 + 0xa0) == 1) {
                                            std::operator<<((ostream *)*in_RDI,"\"");
                                            poVar6 = (ostream *)*in_RDI;
                                            encode_utf8(in_stack_fffffffffffff9d8);
                                            std::operator<<(poVar6,local_1e0);
                                            std::__cxx11::string::~string(local_1e0);
                                            std::operator<<((ostream *)*in_RDI,"\"");
                                          }
                                          else if (*(int *)(local_518 + 0xa0) == 0) {
                                            std::operator<<((ostream *)*in_RDI,"\'");
                                            poVar6 = (ostream *)*in_RDI;
                                            encode_utf8(in_stack_fffffffffffff9d8);
                                            std::operator<<(poVar6,local_200);
                                            std::__cxx11::string::~string(local_200);
                                            std::operator<<((ostream *)*in_RDI,"\'");
                                          }
                                          else if (*(int *)(local_518 + 0xa0) == 2) {
                                            std::operator<<((ostream *)*in_RDI,"|||");
                                            pvVar8 = std::__cxx11::
                                                                                                          
                                                  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                                  ::back(in_stack_fffffffffffff9c0);
                                            if (*pvVar8 != L'\n') {
                                              std::operator<<((ostream *)*in_RDI,"-");
                                            }
                                            std::operator<<((ostream *)*in_RDI,"\n");
                                            pcVar9 = std::__cxx11::
                                                                                                          
                                                  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                                  ::c_str((
                                                  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                                  *)0x3623bc);
                                            if (*pcVar9 != L'\n') {
                                              std::operator<<((ostream *)*in_RDI,
                                                              (string *)(local_1c0 + 0xa8));
                                            }
                                            for (local_208 = std::__cxx11::
                                                                                                                          
                                                  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                                  ::c_str((
                                                  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                                  *)0x3623f4); *local_208 != L'\0';
                                                local_208 = local_208 + 1) {
                                              if (*local_208 != L'\r') {
                                                std::__cxx11::string::string(local_228);
                                                encode_utf8((char32_t)in_stack_fffffffffffff9c0,
                                                            in_stack_fffffffffffff9b8);
                                                std::operator<<((ostream *)*in_RDI,local_228);
                                                if (((*local_208 == L'\n') &&
                                                    (local_208[1] != L'\n')) &&
                                                   (local_208[1] != L'\0')) {
                                                  std::operator<<((ostream *)*in_RDI,
                                                                  (string *)(local_1c0 + 0xa8));
                                                }
                                                std::__cxx11::string::~string(local_228);
                                              }
                                            }
                                            pvVar8 = std::__cxx11::
                                                                                                          
                                                  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                                  ::back(in_stack_fffffffffffff9c0);
                                            if (*pvVar8 != L'\n') {
                                              std::operator<<((ostream *)*in_RDI,"\n");
                                            }
                                            poVar6 = std::operator<<((ostream *)*in_RDI,
                                                                     (string *)(local_1c0 + 200));
                                            std::operator<<(poVar6,"|||");
                                          }
                                          else if (*(int *)(local_518 + 0xa0) == 4) {
                                            std::operator<<((ostream *)*in_RDI,"@\"");
                                            for (local_230 = std::__cxx11::
                                                                                                                          
                                                  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                                  ::c_str((
                                                  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                                  *)0x3625a2); *local_230 != L'\0';
                                                local_230 = local_230 + 1) {
                                              if (*local_230 == L'\"') {
                                                std::operator<<((ostream *)*in_RDI,"\"\"");
                                              }
                                              else {
                                                std::__cxx11::string::string(local_250);
                                                encode_utf8((char32_t)in_stack_fffffffffffff9c0,
                                                            in_stack_fffffffffffff9b8);
                                                std::operator<<((ostream *)*in_RDI,local_250);
                                                std::__cxx11::string::~string(local_250);
                                              }
                                            }
                                            std::operator<<((ostream *)*in_RDI,"\"");
                                          }
                                          else if (*(int *)(local_518 + 0xa0) == 3) {
                                            std::operator<<((ostream *)*in_RDI,"@\'");
                                            for (local_258 = std::__cxx11::
                                                                                                                          
                                                  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                                  ::c_str((
                                                  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                                  *)0x3626d5); *local_258 != L'\0';
                                                local_258 = local_258 + 1) {
                                              if (*local_258 == L'\'') {
                                                std::operator<<((ostream *)*in_RDI,"\'\'");
                                              }
                                              else {
                                                std::__cxx11::string::string(local_278);
                                                encode_utf8((char32_t)in_stack_fffffffffffff9c0,
                                                            in_stack_fffffffffffff9b8);
                                                std::operator<<((ostream *)*in_RDI,local_278);
                                                std::__cxx11::string::~string(local_278);
                                              }
                                            }
                                            std::operator<<((ostream *)*in_RDI,"\'");
                                          }
                                        }
                                      }
                                      else {
                                        std::operator<<((ostream *)*in_RDI,
                                                        (string *)(local_508 + 0x88));
                                      }
                                    }
                                    else {
                                      pcVar12 = "false";
                                      if ((*(byte *)(local_4f8 + 0x80) & 1) != 0) {
                                        pcVar12 = "true";
                                      }
                                      std::operator<<((ostream *)*in_RDI,pcVar12);
                                    }
                                  }
                                  else {
                                    std::operator<<((ostream *)*in_RDI,"local");
                                    sVar7 = std::
                                            vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                                            ::size((
                                                  vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                                                  *)(local_160 + 0x80));
                                    if (sVar7 == 0) {
                                      __assert_fail("ast->binds.size() > 0",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/formatter.cpp"
                                                  ,0x1d0,
                                                  "void jsonnet::internal::Unparser::unparse(const AST *, bool)"
                                                  );
                                    }
                                    local_161 = 1;
                                    local_170 = local_160 + 0x80;
                                    local_178._M_current =
                                         (Bind *)std::
                                                 vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                                                 ::begin((
                                                  vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                                                  *)in_stack_fffffffffffff9b8);
                                    local_180 = (Bind *)std::
                                                  vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                                                  ::end((
                                                  vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                                                  *)in_stack_fffffffffffff9b8);
                                    while( true ) {
                                      bVar4 = __gnu_cxx::operator!=
                                                        ((
                                                  __normal_iterator<const_jsonnet::internal::Local::Bind_*,_std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>_>
                                                  *)in_stack_fffffffffffff9c0,
                                                  (
                                                  __normal_iterator<const_jsonnet::internal::Local::Bind_*,_std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>_>
                                                  *)in_stack_fffffffffffff9b8);
                                      uVar14 = (undefined1)((ulong)local_390 >> 0x38);
                                      if (!bVar4) break;
                                      local_188 = __gnu_cxx::
                                                  __normal_iterator<const_jsonnet::internal::Local::Bind_*,_std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>_>
                                                  ::operator*(&local_178);
                                      if ((local_161 & 1) == 0) {
                                        std::operator<<((ostream *)*in_RDI,",");
                                      }
                                      local_161 = 0;
                                      fill((Unparser *)in_stack_fffffffffffff9c0,
                                           (Fodder *)in_stack_fffffffffffff9b8,false,false);
                                      poVar6 = (ostream *)*in_RDI;
                                      unparse_id_abi_cxx11_((Identifier *)in_stack_fffffffffffff9b8)
                                      ;
                                      std::operator<<(poVar6,local_1a8);
                                      std::__cxx11::string::~string(local_1a8);
                                      if ((local_188->functionSugar & 1U) != 0) {
                                        unparseParams(in_stack_fffffffffffffa40,
                                                      in_stack_fffffffffffffa38,
                                                      (ArgParams *)in_stack_fffffffffffffa30,
                                                      SUB81((ulong)in_stack_fffffffffffffa28 >> 0x38
                                                            ,0),in_stack_fffffffffffffa20);
                                      }
                                      fill((Unparser *)in_stack_fffffffffffff9c0,
                                           (Fodder *)in_stack_fffffffffffff9b8,false,false);
                                      std::operator<<((ostream *)*in_RDI,"=");
                                      unparse(in_RSI,(AST *)CONCAT17(bVar2,CONCAT16(bVar3,
                                                  in_stack_ffffffffffffffe8)),
                                              SUB81((ulong)local_390 >> 0x38,0));
                                      fill((Unparser *)in_stack_fffffffffffff9c0,
                                           (Fodder *)in_stack_fffffffffffff9b8,false,false);
                                      __gnu_cxx::
                                      __normal_iterator<const_jsonnet::internal::Local::Bind_*,_std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>_>
                                      ::operator++(&local_178);
                                    }
                                    std::operator<<((ostream *)*in_RDI,";");
                                    unparse(in_RSI,(AST *)CONCAT17(bVar2,CONCAT16(bVar3,
                                                  in_stack_ffffffffffffffe8)),(bool)uVar14);
                                  }
                                }
                                else {
                                  unparse(in_RSI,(AST *)CONCAT17(bVar2,CONCAT16(bVar3,
                                                  in_stack_ffffffffffffffe8)),(bool)uVar14);
                                  fill((Unparser *)in_stack_fffffffffffff9c0,
                                       (Fodder *)in_stack_fffffffffffff9b8,false,false);
                                  if (*(long *)(local_138 + 0x108) == 0) {
                                    std::operator<<((ostream *)*in_RDI,"[");
                                    if ((*(byte *)(local_138 + 0xa0) & 1) == 0) {
                                      unparse(in_RSI,(AST *)CONCAT17(bVar2,CONCAT16(bVar3,
                                                  in_stack_ffffffffffffffe8)),(bool)uVar14);
                                    }
                                    else {
                                      if (*(long *)(local_138 + 0xa8) != 0) {
                                        unparse(in_RSI,(AST *)CONCAT17(bVar2,CONCAT16(bVar3,
                                                  in_stack_ffffffffffffffe8)),(bool)uVar14);
                                      }
                                      fill((Unparser *)in_stack_fffffffffffff9c0,
                                           (Fodder *)in_stack_fffffffffffff9b8,false,false);
                                      std::operator<<((ostream *)*in_RDI,":");
                                      if (*(long *)(local_138 + 200) != 0) {
                                        unparse(in_RSI,(AST *)CONCAT17(bVar2,CONCAT16(bVar3,
                                                  in_stack_ffffffffffffffe8)),(bool)uVar14);
                                      }
                                      if ((*(long *)(local_138 + 0xe8) != 0) ||
                                         (sVar7 = std::
                                                  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                                  ::size((
                                                  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                                  *)(local_138 + 0xd0)), sVar7 != 0)) {
                                        fill((Unparser *)in_stack_fffffffffffff9c0,
                                             (Fodder *)in_stack_fffffffffffff9b8,false,false);
                                        std::operator<<((ostream *)*in_RDI,":");
                                        if (*(long *)(local_138 + 0xe8) != 0) {
                                          unparse(in_RSI,(AST *)CONCAT17(bVar2,CONCAT16(bVar3,
                                                  in_stack_ffffffffffffffe8)),(bool)uVar14);
                                        }
                                      }
                                    }
                                    fill((Unparser *)in_stack_fffffffffffff9c0,
                                         (Fodder *)in_stack_fffffffffffff9b8,false,false);
                                    std::operator<<((ostream *)*in_RDI,"]");
                                  }
                                  else {
                                    std::operator<<((ostream *)*in_RDI,".");
                                    fill((Unparser *)in_stack_fffffffffffff9c0,
                                         (Fodder *)in_stack_fffffffffffff9b8,false,false);
                                    poVar6 = (ostream *)*in_RDI;
                                    unparse_id_abi_cxx11_((Identifier *)in_stack_fffffffffffff9b8);
                                    std::operator<<(poVar6,local_158);
                                    std::__cxx11::string::~string(local_158);
                                  }
                                }
                              }
                              else {
                                unparse(in_RSI,(AST *)CONCAT17(bVar2,CONCAT16(bVar3,
                                                  in_stack_ffffffffffffffe8)),
                                        SUB81((ulong)local_390 >> 0x38,0));
                                fill((Unparser *)in_stack_fffffffffffff9c0,
                                     (Fodder *)in_stack_fffffffffffff9b8,false,false);
                                std::operator<<((ostream *)*in_RDI,"in");
                                fill((Unparser *)in_stack_fffffffffffff9c0,
                                     (Fodder *)in_stack_fffffffffffff9b8,false,false);
                                std::operator<<((ostream *)*in_RDI,"super");
                              }
                            }
                            else {
                              std::operator<<((ostream *)*in_RDI,"importbin");
                              unparse(in_RSI,(AST *)CONCAT17(bVar2,CONCAT16(bVar3,
                                                  in_stack_ffffffffffffffe8)),(bool)uVar14);
                            }
                          }
                          else {
                            std::operator<<((ostream *)*in_RDI,"importstr");
                            unparse(in_RSI,(AST *)CONCAT17(bVar2,CONCAT16(bVar3,
                                                  in_stack_ffffffffffffffe8)),(bool)uVar14);
                          }
                        }
                        else {
                          std::operator<<((ostream *)*in_RDI,"import");
                          unparse(in_RSI,(AST *)CONCAT17(bVar2,CONCAT16(bVar3,
                                                  in_stack_ffffffffffffffe8)),(bool)uVar14);
                        }
                      }
                      else {
                        std::operator<<((ostream *)*in_RDI,"function");
                        unparseParams(in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                                      (ArgParams *)in_stack_fffffffffffffa30,
                                      SUB81((ulong)in_stack_fffffffffffffa28 >> 0x38,0),
                                      in_stack_fffffffffffffa20);
                        unparse(in_RSI,(AST *)CONCAT17(bVar2,CONCAT16(bVar3,
                                                  in_stack_ffffffffffffffe8)),(bool)uVar14);
                      }
                    }
                    else {
                      std::operator<<((ostream *)*in_RDI,"error");
                      unparse(in_RSI,(AST *)CONCAT17(bVar2,CONCAT16(bVar3,in_stack_ffffffffffffffe8)
                                                    ),(bool)uVar14);
                    }
                  }
                  else {
                    std::operator<<((ostream *)*in_RDI,"$");
                  }
                }
                else {
                  std::operator<<((ostream *)*in_RDI,"if");
                  unparse(in_RSI,(AST *)CONCAT17(bVar2,CONCAT16(bVar3,in_stack_ffffffffffffffe8)),
                          (bool)uVar14);
                  fill((Unparser *)in_stack_fffffffffffff9c0,(Fodder *)in_stack_fffffffffffff9b8,
                       false,false);
                  std::operator<<((ostream *)*in_RDI,"then");
                  if (*(long *)(local_100 + 0xc0) == 0) {
                    unparse(in_RSI,(AST *)CONCAT17(bVar2,CONCAT16(bVar3,in_stack_ffffffffffffffe8)),
                            (bool)uVar14);
                  }
                  else {
                    unparse(in_RSI,(AST *)CONCAT17(bVar2,CONCAT16(bVar3,in_stack_ffffffffffffffe8)),
                            (bool)uVar14);
                    fill((Unparser *)in_stack_fffffffffffff9c0,(Fodder *)in_stack_fffffffffffff9b8,
                         false,false);
                    std::operator<<((ostream *)*in_RDI,"else");
                    unparse(in_RSI,(AST *)CONCAT17(bVar2,CONCAT16(bVar3,in_stack_ffffffffffffffe8)),
                            (bool)uVar14);
                  }
                }
              }
              else {
                poVar6 = std::operator<<((ostream *)*in_RDI,"/* builtin ");
                poVar6 = std::operator<<(poVar6,(string *)(local_f8 + 0x80));
                std::operator<<(poVar6," */ null");
              }
            }
            else {
              unparse(in_RSI,(AST *)CONCAT17(bVar2,CONCAT16(bVar3,in_stack_ffffffffffffffe8)),
                      (bool)uVar14);
              fill((Unparser *)in_stack_fffffffffffff9c0,(Fodder *)in_stack_fffffffffffff9b8,false,
                   false);
              poVar6 = (ostream *)*in_RDI;
              bop_string_abi_cxx11_(bop);
              std::operator<<(poVar6,local_f0);
              std::__cxx11::string::~string(local_f0);
              unparse(in_RSI,(AST *)CONCAT17(bVar2,CONCAT16(bVar3,in_stack_ffffffffffffffe8)),
                      (bool)uVar14);
            }
          }
          else {
            std::operator<<((ostream *)*in_RDI,"assert");
            unparse(in_RSI,(AST *)CONCAT17(bVar2,CONCAT16(bVar3,in_stack_ffffffffffffffe8)),
                    (bool)uVar14);
            if (*(long *)(local_c8 + 0xa0) != 0) {
              fill((Unparser *)in_stack_fffffffffffff9c0,(Fodder *)in_stack_fffffffffffff9b8,false,
                   false);
              std::operator<<((ostream *)*in_RDI,":");
              unparse(in_RSI,(AST *)CONCAT17(bVar2,CONCAT16(bVar3,in_stack_ffffffffffffffe8)),
                      (bool)uVar14);
            }
            fill((Unparser *)in_stack_fffffffffffff9c0,(Fodder *)in_stack_fffffffffffff9b8,false,
                 false);
            std::operator<<((ostream *)*in_RDI,";");
            unparse(in_RSI,(AST *)CONCAT17(bVar2,CONCAT16(bVar3,in_stack_ffffffffffffffe8)),
                    (bool)uVar14);
          }
        }
        else {
          std::operator<<((ostream *)*in_RDI,"[");
          unparse(in_RSI,(AST *)CONCAT17(bVar2,CONCAT16(bVar3,in_stack_ffffffffffffffe8)),
                  (bool)uVar14);
          fill((Unparser *)in_stack_fffffffffffff9c0,(Fodder *)in_stack_fffffffffffff9b8,false,false
              );
          if ((*(byte *)(local_c0 + 0xa0) & 1) != 0) {
            std::operator<<((ostream *)*in_RDI,",");
          }
          unparseSpecs(in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
          fill((Unparser *)in_stack_fffffffffffff9c0,(Fodder *)in_stack_fffffffffffff9b8,false,false
              );
          std::operator<<((ostream *)*in_RDI,"]");
        }
      }
      else {
        std::operator<<((ostream *)*in_RDI,"[");
        local_91 = 1;
        local_a0 = local_90 + 0x80;
        local_a8._M_current =
             (Element *)
             std::
             vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
             ::begin((vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                      *)in_stack_fffffffffffff9b8);
        local_b0 = (Element *)
                   std::
                   vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                   ::end((vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                          *)in_stack_fffffffffffff9b8);
        while (bVar4 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_jsonnet::internal::Array::Element_*,_std::vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>_>
                                   *)in_stack_fffffffffffff9c0,
                                  (__normal_iterator<const_jsonnet::internal::Array::Element_*,_std::vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>_>
                                   *)in_stack_fffffffffffff9b8), bVar4) {
          local_b8 = __gnu_cxx::
                     __normal_iterator<const_jsonnet::internal::Array::Element_*,_std::vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>_>
                     ::operator*(&local_a8);
          if ((local_91 & 1) == 0) {
            std::operator<<((ostream *)*in_RDI,',');
          }
          unparse(in_RSI,(AST *)CONCAT17(bVar2,CONCAT16(bVar3,in_stack_ffffffffffffffe8)),
                  SUB81((ulong)local_390 >> 0x38,0));
          fill((Unparser *)in_stack_fffffffffffff9c0,(Fodder *)in_stack_fffffffffffff9b8,false,false
              );
          local_91 = 0;
          __gnu_cxx::
          __normal_iterator<const_jsonnet::internal::Array::Element_*,_std::vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>_>
          ::operator++(&local_a8);
        }
        if ((*(byte *)(local_90 + 0x98) & 1) != 0) {
          std::operator<<((ostream *)*in_RDI,",");
        }
        std::
        vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
        ::size((vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                *)(local_90 + 0x80));
        fill((Unparser *)in_stack_fffffffffffff9c0,(Fodder *)in_stack_fffffffffffff9b8,false,false);
        std::operator<<((ostream *)*in_RDI,"]");
      }
    }
    else {
      unparse(in_RSI,(AST *)CONCAT17(bVar2,CONCAT16(bVar3,in_stack_ffffffffffffffe8)),bVar4);
      unparse(in_RSI,(AST *)CONCAT17(bVar2,CONCAT16(bVar3,in_stack_ffffffffffffffe8)),bVar4);
    }
  }
  else {
    unparse(in_RSI,(AST *)CONCAT17(bVar2,CONCAT16(bVar3,in_stack_ffffffffffffffe8)),
            SUB81((ulong)local_390 >> 0x38,0));
    fill((Unparser *)in_stack_fffffffffffff9c0,(Fodder *)in_stack_fffffffffffff9b8,false,false);
    std::operator<<((ostream *)*in_RDI,"(");
    local_21 = 1;
    local_30 = local_390 + 0xa0;
    local_38._M_current =
         (ArgParam *)
         std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
         begin((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
               in_stack_fffffffffffff9b8);
    local_40 = (ArgParam *)
               std::
               vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
               end((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                    *)in_stack_fffffffffffff9b8);
    while (bVar4 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
                               *)in_stack_fffffffffffff9c0,
                              (__normal_iterator<const_jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
                               *)in_stack_fffffffffffff9b8), bVar4) {
      local_48 = __gnu_cxx::
                 __normal_iterator<const_jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
                 ::operator*(&local_38);
      if ((local_21 & 1) == 0) {
        std::operator<<((ostream *)*in_RDI,',');
      }
      local_49 = (local_21 ^ 0xff) & 1;
      if (local_48->id != (Identifier *)0x0) {
        fill((Unparser *)in_stack_fffffffffffff9c0,(Fodder *)in_stack_fffffffffffff9b8,false,false);
        poVar6 = (ostream *)*in_RDI;
        unparse_id_abi_cxx11_((Identifier *)in_stack_fffffffffffff9b8);
        std::operator<<(poVar6,local_70);
        std::__cxx11::string::~string(local_70);
        local_49 = 0;
        std::operator<<((ostream *)*in_RDI,"=");
      }
      unparse(in_RSI,(AST *)CONCAT17(bVar2,CONCAT16(bVar3,in_stack_ffffffffffffffe8)),
              SUB81((ulong)local_390 >> 0x38,0));
      fill((Unparser *)in_stack_fffffffffffff9c0,(Fodder *)in_stack_fffffffffffff9b8,false,false);
      local_21 = 0;
      __gnu_cxx::
      __normal_iterator<const_jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
      ::operator++(&local_38);
    }
    if ((*(byte *)(local_390 + 0xb8) & 1) != 0) {
      std::operator<<((ostream *)*in_RDI,",");
    }
    fill((Unparser *)in_stack_fffffffffffff9c0,(Fodder *)in_stack_fffffffffffff9b8,false,false);
    std::operator<<((ostream *)*in_RDI,")");
    if ((*(byte *)(local_390 + 0xf0) & 1) != 0) {
      fill((Unparser *)in_stack_fffffffffffff9c0,(Fodder *)in_stack_fffffffffffff9b8,false,false);
      std::operator<<((ostream *)*in_RDI,"tailstrict");
    }
  }
  return;
}

Assistant:

void unparse(const AST *ast_, bool space_before)
    {
        bool separate_token = !left_recursive(ast_);

        fill(ast_->openFodder, space_before, separate_token);

        if (auto *ast = dynamic_cast<const Apply *>(ast_)) {
            unparse(ast->target, space_before);
            fill(ast->fodderL, false, false);
            o << "(";
            bool first = true;
            for (const auto &arg : ast->args) {
                if (!first)
                    o << ',';
                bool space = !first;
                if (arg.id != nullptr) {
                    fill(arg.idFodder, space, true);
                    o << unparse_id(arg.id);
                    space = false;
                    o << "=";
                }
                unparse(arg.expr, space);
                fill(arg.commaFodder, false, false);
                first = false;
            }
            if (ast->trailingComma)
                o << ",";
            fill(ast->fodderR, false, false);
            o << ")";
            if (ast->tailstrict) {
                fill(ast->tailstrictFodder, true, true);
                o << "tailstrict";
            }

        } else if (auto *ast = dynamic_cast<const ApplyBrace *>(ast_)) {
            unparse(ast->left, space_before);
            unparse(ast->right, true);

        } else if (auto *ast = dynamic_cast<const Array *>(ast_)) {
            o << "[";
            bool first = true;
            for (const auto &element : ast->elements) {
                if (!first)
                    o << ',';
                unparse(element.expr, !first || opts.padArrays);
                fill(element.commaFodder, false, false);
                first = false;
            }
            if (ast->trailingComma)
                o << ",";
            fill(ast->closeFodder, ast->elements.size() > 0, opts.padArrays);
            o << "]";

        } else if (auto *ast = dynamic_cast<const ArrayComprehension *>(ast_)) {
            o << "[";
            unparse(ast->body, opts.padArrays);
            fill(ast->commaFodder, false, false);
            if (ast->trailingComma)
                o << ",";
            unparseSpecs(ast->specs);
            fill(ast->closeFodder, true, opts.padArrays);
            o << "]";

        } else if (auto *ast = dynamic_cast<const Assert *>(ast_)) {
            o << "assert";
            unparse(ast->cond, true);
            if (ast->message != nullptr) {
                fill(ast->colonFodder, true, true);
                o << ":";
                unparse(ast->message, true);
            }
            fill(ast->semicolonFodder, false, false);
            o << ";";
            unparse(ast->rest, true);

        } else if (auto *ast = dynamic_cast<const Binary *>(ast_)) {
            unparse(ast->left, space_before);
            fill(ast->opFodder, true, true);
            o << bop_string(ast->op);
            // The - 1 is for left associativity.
            unparse(ast->right, true);

        } else if (auto *ast = dynamic_cast<const BuiltinFunction *>(ast_)) {
            o << "/* builtin " << ast->name << " */ null";

        } else if (auto *ast = dynamic_cast<const Conditional *>(ast_)) {
            o << "if";
            unparse(ast->cond, true);
            fill(ast->thenFodder, true, true);
            o << "then";
            if (ast->branchFalse != nullptr) {
                unparse(ast->branchTrue, true);
                fill(ast->elseFodder, true, true);
                o << "else";
                unparse(ast->branchFalse, true);
            } else {
                unparse(ast->branchTrue, true);
            }

        } else if (dynamic_cast<const Dollar *>(ast_)) {
            o << "$";

        } else if (auto *ast = dynamic_cast<const Error *>(ast_)) {
            o << "error";
            unparse(ast->expr, true);

        } else if (auto *ast = dynamic_cast<const Function *>(ast_)) {
            o << "function";
            unparseParams(
                ast->parenLeftFodder, ast->params, ast->trailingComma, ast->parenRightFodder);
            unparse(ast->body, true);

        } else if (auto *ast = dynamic_cast<const Import *>(ast_)) {
            o << "import";
            unparse(ast->file, true);

        } else if (auto *ast = dynamic_cast<const Importstr *>(ast_)) {
            o << "importstr";
            unparse(ast->file, true);

        } else if (auto *ast = dynamic_cast<const Importbin *>(ast_)) {
            o << "importbin";
            unparse(ast->file, true);

        } else if (auto *ast = dynamic_cast<const InSuper *>(ast_)) {
            unparse(ast->element, true);
            fill(ast->inFodder, true, true);
            o << "in";
            fill(ast->superFodder, true, true);
            o << "super";

        } else if (auto *ast = dynamic_cast<const Index *>(ast_)) {
            unparse(ast->target, space_before);
            fill(ast->dotFodder, false, false);
            if (ast->id != nullptr) {
                o << ".";
                fill(ast->idFodder, false, false);
                o << unparse_id(ast->id);
            } else {
                o << "[";
                if (ast->isSlice) {
                    if (ast->index != nullptr) {
                        unparse(ast->index, false);
                    }
                    fill(ast->endColonFodder, false, false);
                    o << ":";
                    if (ast->end != nullptr) {
                        unparse(ast->end, false);
                    }
                    if (ast->step != nullptr || ast->stepColonFodder.size() > 0) {
                        fill(ast->stepColonFodder, false, false);
                        o << ":";
                        if (ast->step != nullptr) {
                            unparse(ast->step, false);
                        }
                    }
                } else {
                    unparse(ast->index, false);
                }
                fill(ast->idFodder, false, false);
                o << "]";
            }

        } else if (auto *ast = dynamic_cast<const Local *>(ast_)) {
            o << "local";
            assert(ast->binds.size() > 0);
            bool first = true;
            for (const auto &bind : ast->binds) {
                if (!first)
                    o << ",";
                first = false;
                fill(bind.varFodder, true, true);
                o << unparse_id(bind.var);
                if (bind.functionSugar) {
                    unparseParams(bind.parenLeftFodder,
                                  bind.params,
                                  bind.trailingComma,
                                  bind.parenRightFodder);
                }
                fill(bind.opFodder, true, true);
                o << "=";
                unparse(bind.body, true);
                fill(bind.closeFodder, false, false);
            }
            o << ";";
            unparse(ast->body, true);

        } else if (auto *ast = dynamic_cast<const LiteralBoolean *>(ast_)) {
            o << (ast->value ? "true" : "false");

        } else if (auto *ast = dynamic_cast<const LiteralNumber *>(ast_)) {
            o << ast->originalString;

        } else if (auto *ast = dynamic_cast<const LiteralString *>(ast_)) {
            assert(ast->tokenKind != LiteralString::RAW_DESUGARED);
            if (ast->tokenKind == LiteralString::DOUBLE) {
                o << "\"";
                o << encode_utf8(ast->value);
                o << "\"";
            } else if (ast->tokenKind == LiteralString::SINGLE) {
                o << "'";
                o << encode_utf8(ast->value);
                o << "'";
            } else if (ast->tokenKind == LiteralString::BLOCK) {
                o << "|||";
                if (ast->value.back() != U'\n') {
                    o << "-";
                }
                o << "\n";
                if (ast->value.c_str()[0] != U'\n')
                    o << ast->blockIndent;
                for (const char32_t *cp = ast->value.c_str(); *cp != U'\0'; ++cp) {
                    // Formatter always outputs in unix mode.
                    if (*cp == '\r') continue;
                    std::string utf8;
                    encode_utf8(*cp, utf8);
                    o << utf8;
                    if (*cp == U'\n' && *(cp + 1) != U'\n' && *(cp + 1) != U'\0') {
                        o << ast->blockIndent;
                    }
                }
                if (ast->value.back() != U'\n') {
                    o << "\n";
                }
                o << ast->blockTermIndent << "|||";
            } else if (ast->tokenKind == LiteralString::VERBATIM_DOUBLE) {
                o << "@\"";
                for (const char32_t *cp = ast->value.c_str(); *cp != U'\0'; ++cp) {
                    if (*cp == U'"') {
                        o << "\"\"";
                    } else {
                        std::string utf8;
                        encode_utf8(*cp, utf8);
                        o << utf8;
                    }
                }
                o << "\"";
            } else if (ast->tokenKind == LiteralString::VERBATIM_SINGLE) {
                o << "@'";
                for (const char32_t *cp = ast->value.c_str(); *cp != U'\0'; ++cp) {
                    if (*cp == U'\'') {
                        o << "''";
                    } else {
                        std::string utf8;
                        encode_utf8(*cp, utf8);
                        o << utf8;
                    }
                }
                o << "'";
            }

        } else if (dynamic_cast<const LiteralNull *>(ast_)) {
            o << "null";

        } else if (auto *ast = dynamic_cast<const Object *>(ast_)) {
            o << "{";
            unparseFields(ast->fields, opts.padObjects);
            if (ast->trailingComma)
                o << ",";
            fill(ast->closeFodder, ast->fields.size() > 0, opts.padObjects);
            o << "}";

        } else if (auto *ast = dynamic_cast<const DesugaredObject *>(ast_)) {
            o << "{";
            for (AST *assert : ast->asserts) {
                o << "assert";
                unparse(assert, true);
                o << ",";
            }
            for (auto &field : ast->fields) {
                o << "[";
                unparse(field.name, false);
                o << "]";
                switch (field.hide) {
                    case ObjectField::INHERIT: o << ":"; break;
                    case ObjectField::HIDDEN: o << "::"; break;
                    case ObjectField::VISIBLE: o << ":::"; break;
                }
                unparse(field.body, true);
                o << ",";
            }
            o << "}";

        } else if (auto *ast = dynamic_cast<const ObjectComprehension *>(ast_)) {
            o << "{";
            unparseFields(ast->fields, opts.padObjects);
            if (ast->trailingComma)
                o << ",";
            unparseSpecs(ast->specs);
            fill(ast->closeFodder, true, opts.padObjects);
            o << "}";

        } else if (auto *ast = dynamic_cast<const ObjectComprehensionSimple *>(ast_)) {
            o << "{[";
            unparse(ast->field, false);
            o << "]:";
            unparse(ast->value, true);
            o << " for " << unparse_id(ast->id) << " in";
            unparse(ast->array, true);
            o << "}";

        } else if (auto *ast = dynamic_cast<const Parens *>(ast_)) {
            o << "(";
            unparse(ast->expr, false);
            fill(ast->closeFodder, false, false);
            o << ")";

        } else if (dynamic_cast<const Self *>(ast_)) {
            o << "self";

        } else if (auto *ast = dynamic_cast<const SuperIndex *>(ast_)) {
            o << "super";
            fill(ast->dotFodder, false, false);
            if (ast->id != nullptr) {
                o << ".";
                fill(ast->idFodder, false, false);
                o << unparse_id(ast->id);
            } else {
                o << "[";
                unparse(ast->index, false);
                fill(ast->idFodder, false, false);
                o << "]";
            }

        } else if (auto *ast = dynamic_cast<const Unary *>(ast_)) {
            o << uop_string(ast->op);
            unparse(ast->expr, false);

        } else if (auto *ast = dynamic_cast<const Var *>(ast_)) {
            o << encode_utf8(ast->id->name);

        } else {
            std::cerr << "INTERNAL ERROR: Unknown AST: " << ast_ << std::endl;
            std::abort();
        }
    }